

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regerror.c
# Opt level: O0

size_t set_result(char *errbuf,size_t errbuf_size,char *result)

{
  size_t sVar1;
  size_t local_38;
  size_t copy_len;
  size_t result_len;
  char *result_local;
  size_t errbuf_size_local;
  char *errbuf_local;
  
  sVar1 = strlen(result);
  if (errbuf_size != 0) {
    local_38 = sVar1;
    if (errbuf_size <= sVar1) {
      local_38 = errbuf_size - 1;
    }
    memcpy(errbuf,result,local_38);
    errbuf[local_38] = '\0';
  }
  return sVar1 + 1;
}

Assistant:

static size_t
set_result(char *errbuf, size_t errbuf_size, char *result) {
	size_t result_len = strlen(result);
	if (errbuf_size > 0) {
		size_t copy_len = result_len < errbuf_size ? result_len : errbuf_size - 1;
		memcpy(errbuf, result, copy_len);
		errbuf[copy_len] = '\0';
	}
	return result_len + 1;
}